

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::GetFrameTimestampTest::GetFrameTimestampTest
          (GetFrameTimestampTest *this,EglTestContext *eglTestCtx,NamedFilterList *filters)

{
  char *name;
  char *description;
  TestLog *log;
  allocator<char> local_51;
  string local_50;
  NamedFilterList *local_20;
  NamedFilterList *filters_local;
  EglTestContext *eglTestCtx_local;
  GetFrameTimestampTest *this_local;
  
  local_20 = filters;
  filters_local = (NamedFilterList *)eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  name = NamedFilterList::getName(filters);
  description = NamedFilterList::getDescription(local_20);
  SimpleConfigCase::SimpleConfigCase
            (&this->super_SimpleConfigCase,eglTestCtx,name,description,&local_20->super_FilterList);
  (this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetFrameTimestampTest_0327b7e0;
  this->m_eglGetNextFrameIdANDROID = (eglGetNextFrameIdANDROIDFunc)0x0;
  this->m_eglGetCompositorTimingANDROID = (eglGetCompositorTimingANDROIDFunc)0x0;
  this->m_eglGetCompositorTimingSupportedANDROID = (eglGetCompositorTimingSupportedANDROIDFunc)0x0;
  this->m_eglGetFrameTimestampsANDROID = (eglGetFrameTimestampsANDROIDFunc)0x0;
  this->m_eglGetFrameTimestampSupportedANDROID = (eglGetFrameTimestampSupportedANDROIDFunc)0x0;
  log = tcu::TestContext::getLog
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

GetFrameTimestampTest::GetFrameTimestampTest (EglTestContext& eglTestCtx, const NamedFilterList& filters)
	: SimpleConfigCase							(eglTestCtx, filters.getName(), filters.getDescription(), filters)
	, m_eglGetNextFrameIdANDROID				(DE_NULL)
	, m_eglGetCompositorTimingANDROID			(DE_NULL)
	, m_eglGetCompositorTimingSupportedANDROID	(DE_NULL)
	, m_eglGetFrameTimestampsANDROID			(DE_NULL)
	, m_eglGetFrameTimestampSupportedANDROID	(DE_NULL)
	, m_result									(m_testCtx.getLog())
{
}